

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

int Curl_pgrsDone(connectdata *conn)

{
  SessionHandle *pSVar1;
  int iVar2;
  
  pSVar1 = conn->data;
  (pSVar1->progress).lastshow = 0;
  iVar2 = Curl_pgrsUpdate(conn);
  if (iVar2 == 0) {
    if ((((pSVar1->progress).flags & 0x10) == 0) && ((pSVar1->progress).callback == false)) {
      curl_mfprintf((pSVar1->set).err,"\n");
    }
    (pSVar1->progress).speeder_c = 0;
  }
  return iVar2;
}

Assistant:

int Curl_pgrsDone(struct connectdata *conn)
{
  int rc;
  struct SessionHandle *data = conn->data;
  data->progress.lastshow=0;
  rc = Curl_pgrsUpdate(conn); /* the final (forced) update */
  if(rc)
    return rc;

  if(!(data->progress.flags & PGRS_HIDE) &&
     !data->progress.callback)
    /* only output if we don't use a progress callback and we're not
     * hidden */
    fprintf(data->set.err, "\n");

  data->progress.speeder_c = 0; /* reset the progress meter display */
  return 0;
}